

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

uintm __thiscall ParserContext::getContextBits(ParserContext *this,int4 startbit,int4 size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = size + (startbit & 0x1fU) + -0x20;
  uVar1 = (this->context[startbit >> 5] << (sbyte)(startbit & 0x1fU)) >> (-(char)size & 0x1fU);
  if ((0 < iVar2) && (iVar3 = (startbit >> 5) + 1, iVar3 < this->contextsize)) {
    uVar1 = uVar1 | this->context[iVar3] >> (-(char)iVar2 & 0x1fU);
  }
  return uVar1;
}

Assistant:

uintm ParserContext::getContextBits(int4 startbit,int4 size) const

{
  int4 intstart = startbit / (8*sizeof(uintm));
  uintm res = context[ intstart ]; // Get intm containing highest bit
  int4 bitOffset = startbit % (8*sizeof(uintm));
  int4 unusedBits = 8*sizeof(uintm) - size;
  res <<= bitOffset;	// Shift startbit to highest position
  res >>= unusedBits;
  int4 remaining = size - 8*sizeof(uintm) + bitOffset;
  if ((remaining > 0) && (++intstart < contextsize)) {
    uintm res2 = context[ intstart ];
    unusedBits = 8*sizeof(uintm) - remaining;
    res2 >>= unusedBits;
    res |= res2;
  }
  return res;
}